

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopFont(void)

{
  int iVar1;
  ImFontAtlas *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImFont **ppIVar5;
  ImFont *font;
  
  pIVar3 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar3->FontStack).Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                  ,0x71b,"void ImVector<ImFont *>::pop_back() [T = ImFont *]");
  }
  uVar4 = iVar1 - 1;
  (pIVar3->FontStack).Size = uVar4;
  if (uVar4 == 0) {
    font = (GImGui->IO).FontDefault;
    if (font != (ImFont *)0x0) goto LAB_001376ec;
    pIVar2 = (GImGui->IO).Fonts;
    if ((pIVar2->Fonts).Size < 1) {
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                    ,0x706,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
    }
    ppIVar5 = (pIVar2->Fonts).Data;
  }
  else {
    ppIVar5 = (pIVar3->FontStack).Data + ((ulong)uVar4 - 1);
  }
  font = *ppIVar5;
LAB_001376ec:
  SetCurrentFont(font);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}